

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::baz(TestInterfaceImpl *this,BazContext context)

{
  bool bVar1;
  long *in_RDX;
  Reader params;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  StructReader local_778;
  SegmentReader *local_748;
  CapTableReader *pCStackY_740;
  WirePointer *local_738;
  int iStackY_730;
  undefined4 uStackY_72c;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> local_728;
  PointerReader local_568;
  StructReader local_548;
  StructReader local_518;
  Maybe<kj::Exception> local_4e8;
  Maybe<kj::Exception> local_350;
  StructReader in_stack_fffffffffffffec0;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_350);
  local_728.left.ptr.field_1.value.ownFile.content.size_ =
       local_350.ptr.field_1.value.ownFile.content.size_;
  local_728.left.ptr.field_1.value.ownFile.content.disposer =
       local_350.ptr.field_1.value.ownFile.content.disposer;
  local_728.left.ptr.field_1.value.ownFile.content.ptr =
       local_350.ptr.field_1.value.ownFile.content.ptr;
  PointerReader::getStruct(&local_778,(PointerReader *)&local_728,(word *)0x0);
  if (local_778.pointerCount == 0) {
    local_778.nestingLimit = 0x7fffffff;
    local_778.pointers = (WirePointer *)0x0;
    local_778.segment = (SegmentReader *)0x0;
    local_778.capTable = (CapTableReader *)0x0;
  }
  local_728.left.ptr.field_1._16_4_ = local_778.nestingLimit;
  local_728.left.ptr._0_8_ = local_778.segment;
  local_728.left.ptr.field_1.value.ownFile.content.ptr = (char *)local_778.capTable;
  local_728.left.ptr.field_1.value.ownFile.content.size_ = (size_t)local_778.pointers;
  PointerReader::getStruct(&local_548,(PointerReader *)&local_728,(word *)0x0);
  anon_unknown_133::genericCheckTestMessage<capnproto_test::capnp::test::TestAllTypes::Reader>
            ((Reader)in_stack_fffffffffffffec0);
  (**(code **)(*in_RDX + 8))();
  (**(code **)*in_RDX)(&local_748);
  local_568.pointer = local_738;
  local_568.nestingLimit = iStackY_730;
  local_568._28_4_ = uStackY_72c;
  local_568.segment = local_748;
  local_568.capTable = pCStackY_740;
  PointerReader::getStruct(&local_518,&local_568,(word *)0x0);
  local_4e8.ptr.isSet = false;
  kj::Maybe<kj::Exception>::Maybe(&local_350,&local_4e8);
  bVar1 = local_350.ptr.isSet;
  kj::Maybe<kj::Exception>::Maybe(&local_728.left,&local_350);
  local_728.right = (None *)&kj::none;
  local_728.op.content.ptr = " != ";
  local_728.op.content.size_ = 5;
  local_728.result = bVar1;
  if (local_350.ptr.isSet == true) {
    kj::Exception::~Exception(&local_350.ptr.field_1.value);
  }
  if (local_4e8.ptr.isSet == true) {
    kj::Exception::~Exception(&local_4e8.ptr.field_1.value);
  }
  if ((local_728.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x392,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none\", _kjCondition"
               ,(char (*) [89])
                "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none"
               ,&local_728);
  }
  if (local_728.left.ptr.isSet == true) {
    kj::Exception::~Exception(&local_728.left.ptr.field_1.value);
  }
  kj::_::readyNow();
  (this->super_Server)._vptr_Server = (_func_int **)local_728.left.ptr._0_8_;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::baz(BazContext context) {
  ++callCount;
  auto params = context.getParams();
  checkTestMessage(params.getS());
  context.releaseParams();
  EXPECT_ANY_THROW(context.getParams());

  return kj::READY_NOW;
}